

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
::local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
          (solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
           *this,bit_array *x,row_value *it,int k,int selected,int r_size,float kappa,float delta)

{
  float *args_3;
  float *pfVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int i;
  long lVar9;
  float fVar10;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  int r_size_local;
  int selected_local;
  int local_54;
  long local_50;
  undefined1 local_48 [16];
  
  local_50 = (long)k;
  args_3 = (float *)(*(long *)(this + 0x78) + local_50 * 4);
  fVar10 = *args_3;
  local_48 = ZEXT416((uint)fVar10);
  fVar3 = kappa / (1.0 - kappa) + delta;
  r_size_local = r_size;
  selected_local = selected;
  local_54 = k;
  if (selected < 0) {
    pfVar1 = *(float **)(this + 0x60);
    *args_3 = fVar10 + *pfVar1 * 0.5;
    fmt_00._M_str = "    selected: {}/{} ({})/2 = pi {}\n";
    fmt_00._M_len = 0x23;
    debug_logger<true>::log<int,int,float,float>
              ((debug_logger<true> *)this,fmt_00,&selected_local,&r_size_local,pfVar1,args_3);
    lVar9 = 4;
    for (uVar8 = 0; uVar8 != (uint)r_size_local; uVar8 = uVar8 + 1) {
      iVar6 = *(int *)(*(long *)(this + 0x60) + lVar9);
      bit_array_impl::unset(&x->super_bit_array_impl,it[iVar6].column);
      *(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4) =
           *(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4) - fVar3;
      fVar10 = solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
               ::local_compute_reduced_cost<baryonyx::bit_array>
                         ((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                           *)this,it[iVar6].column,x);
      if (fVar10 <= 0.0) {
        *(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4) =
             (fVar10 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4)) - fVar3;
      }
      lVar9 = lVar9 + 0xc;
    }
  }
  else {
    lVar9 = *(long *)(this + 0x60);
    fVar2 = *(float *)(lVar9 + (ulong)(uint)selected * 0xc);
    pfVar1 = (float *)(lVar9 + (ulong)(uint)selected * 0xc);
    if ((int)(selected + 1U) < r_size) {
      lVar7 = (ulong)(selected + 1U) * 0xc;
      *args_3 = fVar10 + (fVar2 + *(float *)(lVar9 + lVar7)) * 0.5;
      fmt._M_str = "    selected: {}/{} ({}x{})/2 = pi {}\n";
      fmt._M_len = 0x26;
      debug_logger<true>::log<int,int,float,float,float>
                ((debug_logger<true> *)this,fmt,&selected_local,&r_size_local,pfVar1,
                 (float *)(lVar9 + lVar7),args_3);
      lVar9 = 4;
      for (uVar8 = 0; (long)uVar8 <= (long)selected_local; uVar8 = uVar8 + 1) {
        iVar6 = *(int *)(*(long *)(this + 0x60) + lVar9);
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar6].column);
        *(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4) =
             fVar3 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4);
        fVar10 = solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                             *)this,it[iVar6].column,x);
        if (0.0 <= fVar10) {
          *(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4) =
               (*(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4) - fVar10) + fVar3;
        }
        lVar9 = lVar9 + 0xc;
      }
      for (; uVar8 != (uint)r_size_local; uVar8 = uVar8 + 1) {
        iVar6 = *(int *)(*(long *)(this + 0x60) + lVar9);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar6].column);
        *(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4) =
             *(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4) - fVar3;
        fVar10 = solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                             *)this,it[iVar6].column,x);
        if (fVar10 <= 0.0) {
          *(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4) =
               (fVar10 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4)) - fVar3;
        }
        lVar9 = lVar9 + 0xc;
      }
    }
    else {
      auVar4 = vfmadd132ss_fma(ZEXT416((uint)fVar2),local_48,ZEXT416(0x3fc00000));
      *args_3 = auVar4._0_4_;
      fmt_01._M_str = "    selected: {}/{} ({})/2 = pi {}\n";
      fmt_01._M_len = 0x23;
      debug_logger<true>::log<int,int,float,float>
                ((debug_logger<true> *)this,fmt_01,&selected_local,&r_size_local,pfVar1,args_3);
      lVar9 = 4;
      for (uVar8 = 0; uVar8 != (uint)r_size_local; uVar8 = uVar8 + 1) {
        iVar6 = *(int *)(*(long *)(this + 0x60) + lVar9);
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar6].column);
        *(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4) =
             fVar3 + *(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4);
        fVar10 = solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                             *)this,it[iVar6].column,x);
        if (0.0 <= fVar10) {
          *(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4) =
               (*(float *)(*(long *)(this + 0x50) + (long)it[iVar6].value * 4) - fVar10) + fVar3;
        }
        lVar9 = lVar9 + 0xc;
      }
    }
  }
  bVar5 = is_valid_constraint<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array>
                    ((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                      *)this,local_54,x);
  if (bVar5) {
    iVar6 = vmovmskps_avx(local_48);
    return (bool)((byte)((byte)((uint)(iVar6 << 0x1f) >> 0x18) ^
                        (byte)((uint)*(undefined4 *)(*(long *)(this + 0x78) + local_50 * 4) >> 0x18)
                        ) >> 7);
  }
  details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-Z.cpp"
                     ,"436");
}

Assistant:

bool local_affect(Xtype& x,
                      Iterator it,
                      int k,
                      int selected,
                      int r_size,
                      const Float kappa,
                      const Float delta)
    {
        constexpr Float one{ 1 };
        constexpr Float two{ 2 };
        constexpr Float middle{ (two + one) / two };

        const auto old_pi = pi[k];

        auto d = (kappa / (one - kappa)) + delta;

        if (selected < 0) {
            pi[k] += R[0].value / two;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[0].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        } else if (selected + 1 >= r_size) {
            pi[k] += R[selected].value * middle;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }
        } else {
            pi[k] += ((R[selected].value + R[selected + 1].value) / two);

            logger::log("    selected: {}/{} ({}x{})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        R[selected + 1].value,
                        pi[k]);

            int i = 0;
            for (; i <= selected; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }

            for (; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        }

        // TODO job: develops is_valid_constraint for all the solvers
        bx_expects(is_valid_constraint(*this, k, x));

        return is_signbit_change(old_pi, pi[k]);
    }